

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::initiatorFixtureLookUpSession_InvalidSessionHeader_NoSessionReturnedHelper::
~initiatorFixtureLookUpSession_InvalidSessionHeader_NoSessionReturnedHelper
          (initiatorFixtureLookUpSession_InvalidSessionHeader_NoSessionReturnedHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)&this[-1].m_details);
  operator_delete(&this[-1].m_details,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LookUpSession_InvalidSessionHeader_NoSessionReturned)
{
  startLoggedOn();
  std::string delimSOH = "\x01";
  std::string header = "8=FIX.4.2" + delimSOH
      + "35=A" + delimSOH //header out of order;
      + "9=100" + delimSOH;

  Session* actualSession = object->lookupSession(header, false);
  CHECK(nullptr == actualSession);
}